

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_evaluator.cpp
# Opt level: O0

void __thiscall
TestEvaluator_TestForRange_Test::~TestEvaluator_TestForRange_Test
          (TestEvaluator_TestForRange_Test *this)

{
  TestEvaluator_TestForRange_Test *this_local;
  
  ~TestEvaluator_TestForRange_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestEvaluator, TestForRange){
    cout << R"(
                ----- test_for_range -----
               )" << endl;
    string buff = R"(
                    init sum = 0
                    for i in (1..10){
                      sum = sum + 1
                    }
                    return sum
                  )";
    Lexer* l = Lexer::New(buff);
    Parser* parser = Parser::New(l);
    auto env = Evaluator::NewEnvironment();
    auto program = parser->parseProgram();
    auto obj = Evaluator::evalProgram(program, env);
    EXPECT_TRUE(obj.size() == 3);
    EXPECT_EQ(obj.back()->type(), Types::INTTYPE);
}